

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O1

void deductible_under_min(LossRec *x,OASIS_FLOAT min_ded,OASIS_FLOAT ded)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = x->effective_deductible;
  fVar2 = x->over_limit;
  fVar4 = (min_ded - ded) - fVar1;
  if (fVar4 <= fVar2) {
    fVar3 = x->loss;
    fVar4 = fVar2 - fVar4;
    if (ded < fVar3) {
      x->over_limit = fVar4;
      x->effective_deductible = min_ded;
      goto LAB_0010b9ce;
    }
    if (fVar4 + fVar3 <= ded) {
      x->effective_deductible = fVar2 + fVar1 + fVar3;
      x->over_limit = 0.0;
    }
    else {
      x->over_limit = fVar4 + ded;
      x->effective_deductible = min_ded;
    }
    x->under_limit = fVar3 + x->under_limit;
  }
  else {
    fVar4 = fVar4 - fVar2;
    fVar3 = x->loss;
    if (fVar4 + ded < fVar3) {
      fVar3 = (fVar3 - fVar4) - ded;
      x->over_limit = 0.0;
      x->effective_deductible = min_ded;
      x->under_limit = fVar4 + x->under_limit;
      goto LAB_0010b9ce;
    }
    x->effective_deductible = fVar2 + fVar1 + fVar3;
    x->under_limit = fVar3 + x->under_limit;
    x->over_limit = 0.0;
  }
  fVar3 = 0.0;
LAB_0010b9ce:
  x->loss = fVar3;
  return;
}

Assistant:

void deductible_under_min(LossRec& x, OASIS_FLOAT min_ded, OASIS_FLOAT ded)
{ //If effective deductible + current deductible is less than the minimum, deductible will be increased to the minimum
	OASIS_FLOAT loss_delta =0;
	OASIS_FLOAT loss =0;
	OASIS_FLOAT loss_not_over_limit = 0;
	loss_delta = min_ded - ded - x.effective_deductible ; // loss to increase by the loss_delta	
	if (loss_delta <= x.over_limit) {
		if (x.loss > ded) {
			loss = x.loss;
			x.over_limit = x.over_limit - loss_delta;
			x.effective_deductible = min_ded;
		}
		else if (x.over_limit - loss_delta + x.loss > ded) {
			loss = 0;
			x.over_limit = x.over_limit - loss_delta + ded;
			x.effective_deductible = min_ded;
			x.under_limit = x.under_limit + x.loss;
		}
		else {
			x.effective_deductible = x.effective_deductible + x.loss + x.over_limit;
			loss = 0;
			x.over_limit = 0;
			x.under_limit = x.under_limit + x.loss;
		}
	}
	else {
		loss_not_over_limit = loss_delta - x.over_limit;
		if (x.loss > (loss_not_over_limit + ded)) {
			loss = x.loss - loss_not_over_limit - ded;
			x.over_limit = 0;
			x.effective_deductible = min_ded;
			x.under_limit = x.under_limit + loss_not_over_limit;
		}
		else {
			loss = 0;
			x.effective_deductible = x.effective_deductible + x.loss + x.over_limit;
			x.under_limit = x.under_limit + x.loss;
			x.over_limit = 0;
		}
	}
	x.loss = loss;
}